

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::FormulasLoader::end__apply(FormulasLoader *this)

{
  Operator OVar1;
  _func_int **pp_Var2;
  int iVar3;
  _Elt_pointer pOVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Elt_pointer pvVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  NodeVector nodes;
  
  this->mCurrentApplyHasChild = true;
  pvVar5 = (this->mNodeListStack).c.
           super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar5 == (this->mNodeListStack).c.
                super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar8 = false;
  }
  else {
    if (pvVar5 == (this->mNodeListStack).c.
                  super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar5 = (this->mNodeListStack).c.
               super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::vector
              (&nodes,pvVar5 + -1);
    std::
    deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
    ::pop_back(&(this->mNodeListStack).c);
    bVar8 = nodes.super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            nodes.super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (bVar8) {
      pOVar4 = (this->mOperatorStack).c.
               super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pOVar4 == (this->mOperatorStack).c.
                    super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::allocMemory
                  (&this->mCurrentFormula->mMathmlAsts,
                   (long)nodes.
                         super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)nodes.
                         super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,1);
        lVar7 = 0;
        for (uVar6 = 0;
            uVar6 < (ulong)((long)nodes.
                                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)nodes.
                                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1
            ) {
          COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append
                    (&this->mCurrentFormula->mMathmlAsts,
                     (INode **)
                     ((long)nodes.
                            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar7));
          lVar7 = lVar7 + 8;
        }
      }
      else {
        if (pOVar4 == (this->mOperatorStack).c.
                      super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pOVar4 = (this->mOperatorStack).c.
                   super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        OVar1 = pOVar4[-1];
        std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>::pop_back
                  (&(this->mOperatorStack).c);
        iVar3 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x146])(this,(ulong)OVar1);
        if ((char)iVar3 == '\0') {
          if (OVar1 == USER_DEFINED_FUNCTION) {
            iVar3 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x145])(this,&nodes);
            (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                      (this,CONCAT44(extraout_var_00,iVar3));
          }
          else {
            pp_Var2 = (this->super_HelperLoaderBase)._vptr_HelperLoaderBase;
            if ((long)nodes.
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)nodes.
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8) {
              iVar3 = (*pp_Var2[0x13f])(this,&nodes,(ulong)OVar1);
              (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                        (this,CONCAT44(extraout_var_01,iVar3));
            }
            else {
              iVar3 = (*pp_Var2[0x140])(this,&nodes,(ulong)OVar1);
              (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                        (this,CONCAT44(extraout_var_02,iVar3));
            }
          }
        }
        else {
          iVar3 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x144])
                            (this,&nodes,(ulong)OVar1);
          (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                    (this,CONCAT44(extraout_var,iVar3));
        }
      }
    }
    std::_Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::~_Vector_base
              (&nodes.
                super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>);
  }
  return bVar8;
}

Assistant:

bool FormulasLoader::end__apply()
	{
		mCurrentApplyHasChild = true;

		if ( mNodeListStack.empty() )
		{
			// TODO error handling
			return false;
		}

		NodeVector nodes = mNodeListStack.top();
		mNodeListStack.pop();
		size_t numOfNodes = nodes.size();

		if ( numOfNodes == 0 )
		{
			// TODO error handling
			return false;
		}

		if ( mOperatorStack.empty() )
		{
			mCurrentFormula->getMathmlAsts().allocMemory( nodes.size() );
			for (size_t i=0; i<nodes.size(); ++i)
			{
				mCurrentFormula->getMathmlAsts().append( nodes[ i ] );
			}
		}
		else
		{
			Operator op = mOperatorStack.top();
			mOperatorStack.pop();

			if ( isFunction( op ) )
			{
				MathML::AST::INode* node = createFunctionOperation( nodes, op );
				appendNewNode( node );
			}
			else if ( op == USER_DEFINED_FUNCTION )
			{
				MathML::AST::INode* node = createUserDefinedFunctionOperation( nodes );
				appendNewNode( node );
			}
			else
			{
				switch ( numOfNodes )
				{

				case 1:
					{
						MathML::AST::INode* node = createUnaryOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				default:
					{
						MathML::AST::INode* node = createMultiOperandOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				}
			}
		}

		return true;
	}